

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

Context * __thiscall
Hpipe::Context::with_string(Context *__return_storage_ptr__,Context *this,string *str)

{
  size_type sVar1;
  ostream *poVar2;
  size_type sVar3;
  mapped_type *this_00;
  Vec<unsigned_int> local_50;
  undefined1 local_21;
  key_type *local_20;
  string *str_local;
  Context *this_local;
  Context *res;
  
  local_21 = 0;
  local_20 = str;
  str_local = (string *)this;
  this_local = __return_storage_ptr__;
  Context(__return_storage_ptr__,this);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
          ::count(&__return_storage_ptr__->paths_to_strings,local_20);
  if (sVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar2 = std::operator<<(poVar2,(string *)local_20);
    poVar2 = std::operator<<(poVar2," is already in the context");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  sVar3 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                    ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                     this);
  range_vec<unsigned_int>(&local_50,(uint)sVar3);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
            ::operator[](&__return_storage_ptr__->paths_to_strings,local_20);
  Vec<unsigned_int>::operator=(this_00,&local_50);
  Vec<unsigned_int>::~Vec(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Context Context::with_string( const std::string &str ) const {
    Context res( *this );
    if ( res.paths_to_strings.count( str ) )
        std::cerr << "Error: " << str << " is already in the context" << std::endl;
    res.paths_to_strings[ str ] = range_vec( unsigned( pos.size() ) );
    return res;
}